

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_C2S_UDP_DATA(void)

{
  uint uVar1;
  int iVar2;
  undefined1 local_258 [4];
  uint32_t newlen;
  PipeMsg newmsg;
  uint32_t len;
  int i;
  PipeMsg msg;
  uint8_t *buf;
  
  msg.field_1._272_8_ = operator_new__(0x40000);
  MsgHelper::initMsg((PipeMsg *)&len,C2S_UDP_DATA);
  msg._4_1_ = 2;
  msg.type = S2C_UDP_DATA;
  msg._1_3_ = 0;
  msg.field_1._0_8_ = malloc(5);
  msg.field_1._10_2_ = 0xffff;
  msg.field_1.c2s_request.ADDR.ADDR[2] = '\x03';
  strcpy((char *)((long)&msg.field_1 + 0xc),"www.baidu.com");
  for (newmsg.field_1._276_4_ = 0; (uint)newmsg.field_1._276_4_ < (uint)msg._0_4_;
      newmsg.field_1._276_4_ = newmsg.field_1._276_4_ + 1) {
    *(char *)(msg.field_1._0_8_ + (long)(int)newmsg.field_1._276_4_) =
         (char)newmsg.field_1._276_4_ + '\x01';
  }
  newmsg.field_1._272_4_ = MsgHelper::serializeMsg((PipeMsg *)&len,(uint8_t *)msg.field_1._272_8_);
  printHex((uchar *)msg.field_1._272_8_,newmsg.field_1._272_4_);
  uVar1 = MsgHelper::deserializeMsg((uint8_t *)msg.field_1._272_8_,0x40000,(PipeMsg *)local_258);
  printf("len = %d, newlen = %d\n",(ulong)(uint)newmsg.field_1._272_4_,(ulong)uVar1);
  if (uVar1 != newmsg.field_1._272_4_) {
    __assert_fail("newlen == len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x13b,"void test_C2S_UDP_DATA()");
  }
  iVar2 = memcmp((void *)msg.field_1._0_8_,(void *)newmsg.field_1._0_8_,(ulong)(uint)msg._0_4_);
  if (iVar2 != 0) {
    __assert_fail("memcmp(msg.common_udp_data.DATA, newmsg.common_udp_data.DATA, msg.common_udp_data.LEN) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x13d,"void test_C2S_UDP_DATA()");
  }
  MsgHelper::printMsg((PipeMsg *)&len);
  MsgHelper::printMsg((PipeMsg *)local_258);
  MsgHelper::destroyMsg((PipeMsg *)&len);
  MsgHelper::destroyMsg((PipeMsg *)local_258);
  if (msg.field_1._272_8_ != 0) {
    operator_delete__((void *)msg.field_1._272_8_);
  }
  return;
}

Assistant:

void test_C2S_UDP_DATA()
{
	// LEN = size(MSG)
	// +---------+--------+------+------+----------+----------+----------+
	// | MSGTYPE | METHOD | LEN  | ATYP | DST.ADDR | DST.PORT |   DATA   |
	// +---------+--------+------+------+----------+----------+----------+
	// |   1     |   1    |  4   |  1   | Variable |    2     | Variable |
	// +---------+--------+------+------+----------+----------+----------+
	uint8_t *buf = new uint8_t[MSG_MAX_SIZE];
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_UDP_DATA);
	msg.common_udp_data.METHOD = 2;
	msg.common_udp_data.LEN = 5;
	msg.common_udp_data.DATA = (uint8_t*)fc_malloc(msg.common_tcp_data.LEN);
	
	// SOKS5_ATYP_IPV4
	// SOKS5_ATYP_DOMAIN
	// SOKS5_ATYP_IPV6
	msg.common_udp_data.ADDR.PORT = 65535;
	msg.common_udp_data.ADDR.ATYP = SOKS5_ATYP_DOMAIN;
	
	if(msg.common_udp_data.ADDR.ATYP == SOKS5_ATYP_IPV4)
	{
		strcpy(msg.common_udp_data.ADDR.ADDR, "47.75.218.200");
	}
	else if(msg.common_udp_data.ADDR.ATYP == SOKS5_ATYP_IPV6)
	{
		// fe80:0000:0000:0000:0000:0000:0001:0000  fe80::0001:0000
		strcpy(msg.common_udp_data.ADDR.ADDR, "fe80::0001:0000");
	}
	else if(msg.common_udp_data.ADDR.ATYP == SOKS5_ATYP_DOMAIN)
	{
		strcpy(msg.common_udp_data.ADDR.ADDR, "www.baidu.com");
	}
	
	for(auto i = 0; i < msg.common_udp_data.LEN; ++i)
		msg.common_udp_data.DATA[i] = i + 1;
	
	uint32_t len = MsgHelper::serializeMsg(&msg, buf);
	printHex(buf, len);
	
	PipeMsg newmsg;
	uint32_t newlen = MsgHelper::deserializeMsg(buf, MSG_MAX_SIZE, &newmsg);

	printf("len = %d, newlen = %d\n", len, newlen);
	assert(newlen == len);
	
	assert(memcmp(msg.common_udp_data.DATA, newmsg.common_udp_data.DATA, msg.common_udp_data.LEN) == 0);
	
	MsgHelper::printMsg(&msg);
	MsgHelper::printMsg(&newmsg);	
	MsgHelper::destroyMsg(&msg);
	MsgHelper::destroyMsg(&newmsg);
	
	delete[]buf;
}